

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void tf_accumulate_frame_diff(AV1_COMP *cpi,int num_workers)

{
  undefined1 *puVar1;
  TemporalFilterData *pTVar2;
  FRAME_DIFF *diff;
  ThreadData_conflict *td;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  FRAME_DIFF *total_diff;
  int num_workers_local;
  AV1_COMP *cpi_local;
  
  pTVar2 = &(cpi->td).tf_data;
  for (i = num_workers + -1; -1 < i; i = i + -1) {
    puVar1 = *(undefined1 **)((long)(cpi->mt_info).workers[i].data1 + 8);
    if ((ThreadData_conflict *)puVar1 != &cpi->td) {
      (cpi->td).tf_data.diff.sse = *(long *)(puVar1 + 0x25d98) + (cpi->td).tf_data.diff.sse;
      (pTVar2->diff).sum = *(long *)(puVar1 + 0x25d90) + (pTVar2->diff).sum;
    }
  }
  return;
}

Assistant:

static void tf_accumulate_frame_diff(AV1_COMP *cpi, int num_workers) {
  FRAME_DIFF *total_diff = &cpi->td.tf_data.diff;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &cpi->mt_info.workers[i];
    EncWorkerData *const thread_data = (EncWorkerData *)worker->data1;
    ThreadData *td = thread_data->td;
    FRAME_DIFF *diff = &td->tf_data.diff;
    if (td != &cpi->td) {
      total_diff->sse += diff->sse;
      total_diff->sum += diff->sum;
    }
  }
}